

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O2

ostream * wasm::WATParser::operator<<(ostream *os,StringTok *tok)

{
  ostream *poVar1;
  
  if ((tok->str).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    poVar1 = std::operator<<(os,'\"');
    poVar1 = std::operator<<(poVar1,(string *)tok);
    std::operator<<(poVar1,'\"');
  }
  else {
    std::operator<<(os,"(raw string)");
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const StringTok& tok) {
  if (tok.str) {
    os << '"' << *tok.str << '"';
  } else {
    os << "(raw string)";
  }
  return os;
}